

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&> __thiscall
kj::
Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
::find<0ul,unsigned_long&>
          (Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
           *this,unsigned_long *params)

{
  Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&> MVar1;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> table;
  HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
  local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
  find<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long&>
            (local_20,table,(unsigned_long *)((long)(*(long *)(this + 8) - *(size_t *)this) >> 4));
  MVar1.ptr = (Entry *)0x0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>)0x0)
  {
    MVar1.ptr = (Entry *)(local_18 * 0x10 + *(long *)this);
  }
  return (Maybe<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry_&>)
         MVar1.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}